

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::_InternalSerialize
          (VisionFeaturePrint *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  VisionFeaturePrint_Scene *this_00;
  VisionFeaturePrint_Objects *this_01;
  void *data;
  uint32_t uVar2;
  ulong uVar3;
  int size;
  uint8_t *puVar4;
  size_t __n;
  
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 0x14) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = (this->VisionFeaturePrintType_).scene_;
    target[0] = 0xa2;
    target[1] = '\x01';
    uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[2] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 3;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 2);
    }
    target = VisionFeaturePrint_Scene::_InternalSerialize(this_00,puVar4,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 0x15) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = (this->VisionFeaturePrintType_).objects_;
    target[0] = 0xaa;
    target[1] = '\x01';
    uVar1 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[2] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 3;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 2);
    }
    target = VisionFeaturePrint_Objects::_InternalSerialize(this_01,puVar4,stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 & 0xfffffffffffffffc;
    data = *(void **)(uVar3 + 8);
    size = (int)*(undefined8 *)(uVar3 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar4;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* VisionFeaturePrint::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene scene = 20;
  if (_internal_has_scene()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        20, _Internal::scene(this), target, stream);
  }

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects objects = 21;
  if (_internal_has_objects()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        21, _Internal::objects(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  return target;
}